

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sum_squares_avx2.c
# Opt level: O0

uint64_t aom_sum_sse_2d_i16_avx2(int16_t *src,int src_stride,int width,int height,int *sum)

{
  uint in_ECX;
  uint in_EDX;
  int in_ESI;
  int16_t *in_RDI;
  int *in_R8;
  int *in_stack_00000058;
  int in_stack_00000064;
  int16_t *in_stack_00000068;
  int *in_stack_00000150;
  int in_stack_0000015c;
  int in_stack_00000160;
  int in_stack_00000164;
  int16_t *in_stack_00000168;
  int *in_stack_00000340;
  int in_stack_0000034c;
  int in_stack_00000350;
  int in_stack_00000354;
  int16_t *in_stack_00000358;
  undefined4 in_stack_ffffffffffffffe0;
  uint64_t local_8;
  
  if (in_EDX == 4 && in_ECX == 4) {
    local_8 = aom_sum_sse_2d_i16_4x4_sse2(in_stack_00000068,in_stack_00000064,in_stack_00000058);
  }
  else if (in_EDX == 4 && (in_ECX & 3) == 0) {
    local_8 = aom_sum_sse_2d_i16_4xn_sse2
                        (in_RDI,in_ESI,in_EDX,(int *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0));
  }
  else if (in_EDX == 8 && (in_ECX & 3) == 0) {
    local_8 = aom_sum_sse_2d_i16_nxn_sse2
                        (in_stack_00000168,in_stack_00000164,in_stack_00000160,in_stack_0000015c,
                         in_stack_00000150);
  }
  else if ((in_EDX & 0xf) == 0 && (in_ECX & 3) == 0) {
    local_8 = aom_sum_sse_2d_i16_nxn_avx2
                        (in_stack_00000358,in_stack_00000354,in_stack_00000350,in_stack_0000034c,
                         in_stack_00000340);
  }
  else {
    local_8 = aom_sum_sse_2d_i16_c(in_RDI,in_ESI,in_EDX,in_ECX,in_R8);
  }
  return local_8;
}

Assistant:

uint64_t aom_sum_sse_2d_i16_avx2(const int16_t *src, int src_stride, int width,
                                 int height, int *sum) {
  if (LIKELY(width == 4 && height == 4)) {
    return aom_sum_sse_2d_i16_4x4_sse2(src, src_stride, sum);
  } else if (LIKELY(width == 4 && (height & 3) == 0)) {
    return aom_sum_sse_2d_i16_4xn_sse2(src, src_stride, height, sum);
  } else if (LIKELY(width == 8 && (height & 3) == 0)) {
    return aom_sum_sse_2d_i16_nxn_sse2(src, src_stride, width, height, sum);
  } else if (LIKELY(((width & 15) == 0) && ((height & 3) == 0))) {
    return aom_sum_sse_2d_i16_nxn_avx2(src, src_stride, width, height, sum);
  } else {
    return aom_sum_sse_2d_i16_c(src, src_stride, width, height, sum);
  }
}